

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O0

REF_STATUS
ref_oct_unique_corner_nodes_node(REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_NODE ref_node)

{
  int insert_node_00;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_DBL box [6];
  int local_7c;
  REF_INT child_index;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT insert_node;
  REF_DBL xyz [3];
  int local_38;
  int local_34;
  REF_INT new_node;
  REF_INT corner;
  REF_NODE ref_node_local;
  REF_DBL *bbox_local;
  REF_OCT pRStack_18;
  REF_INT node_local;
  REF_OCT ref_oct_local;
  
  _new_node = ref_node;
  ref_node_local = (REF_NODE)bbox;
  bbox_local._4_4_ = node;
  pRStack_18 = ref_oct;
  if (ref_oct->children[node << 3] == -1) {
    for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
      if (pRStack_18->nodes[local_34 + bbox_local._4_4_ * 0x1b] == -1) {
        insert_node_00 = pRStack_18->nnode;
        pRStack_18->nnode = pRStack_18->nnode + 1;
        uVar1 = ref_node_add(_new_node,(long)insert_node_00,&local_38);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x11d,"ref_oct_unique_corner_nodes_node",(ulong)uVar1,"add node");
          return uVar1;
        }
        if ((long)insert_node_00 != (long)local_38) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x11e,"ref_oct_unique_corner_nodes_node","expects to match",(long)insert_node_00,
                 (long)local_38);
          return 1;
        }
        uVar1 = ref_oct_bbox_corner((REF_DBL *)ref_node_local,local_34,
                                    (REF_DBL *)&ref_private_macro_code_rss);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x11f,"ref_oct_unique_corner_nodes_node",(ulong)uVar1,"corner xyz");
          return uVar1;
        }
        _new_node->real[local_38 * 0xf] = _ref_private_macro_code_rss;
        _new_node->real[local_38 * 0xf + 1] = xyz[0];
        _new_node->real[local_38 * 0xf + 2] = xyz[1];
        uVar1 = ref_oct_set_node_at(pRStack_18,insert_node_00,(REF_DBL *)&ref_private_macro_code_rss
                                   );
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x123,"ref_oct_unique_corner_nodes_node",(ulong)uVar1,"set node");
          return uVar1;
        }
      }
      if (pRStack_18->nodes[local_34 + bbox_local._4_4_ * 0x1b] == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x125
               ,"ref_oct_unique_corner_nodes_node","self not set");
        return 1;
      }
    }
  }
  else {
    for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
      uVar1 = ref_oct_child_bbox((REF_DBL *)ref_node_local,local_7c,
                                 (REF_DBL *)&ref_private_macro_code_rss_4);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",299,
               "ref_oct_unique_corner_nodes_node",(ulong)uVar1,"bbox");
        return uVar1;
      }
      uVar1 = ref_oct_unique_corner_nodes_node
                        (pRStack_18,pRStack_18->children[local_7c + bbox_local._4_4_ * 8],
                         (REF_DBL *)&ref_private_macro_code_rss_4,_new_node);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x12f
               ,"ref_oct_unique_corner_nodes_node",(ulong)uVar1,"recurse");
        return uVar1;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_unique_corner_nodes_node(REF_OCT ref_oct,
                                                           REF_INT node,
                                                           REF_DBL *bbox,
                                                           REF_NODE ref_node) {
  if (ref_oct_leaf_node(ref_oct, node)) {
    REF_INT corner;
    for (corner = 0; corner < 8; corner++) {
      if (REF_EMPTY == ref_oct_c2n(ref_oct, corner, node)) {
        REF_INT new_node;
        REF_DBL xyz[3];
        REF_INT insert_node;
        insert_node = ref_oct_nnode(ref_oct);
        ref_oct_nnode(ref_oct)++;
        RSS(ref_node_add(ref_node, insert_node, &new_node), "add node");
        REIS(insert_node, new_node, "expects to match");
        RSS(ref_oct_bbox_corner(bbox, corner, xyz), "corner xyz");
        ref_node_xyz(ref_node, 0, new_node) = xyz[0];
        ref_node_xyz(ref_node, 1, new_node) = xyz[1];
        ref_node_xyz(ref_node, 2, new_node) = xyz[2];
        RSS(ref_oct_set_node_at(ref_oct, insert_node, xyz), "set node");
      }
      RUS(REF_EMPTY, ref_oct_c2n(ref_oct, corner, node), "self not set");
    }
  } else {
    REF_INT child_index;
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RSS(ref_oct_unique_corner_nodes_node(
              ref_oct, ref_oct_child(ref_oct, child_index, node), box,
              ref_node),
          "recurse");
    }
  }
  return REF_SUCCESS;
}